

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

string * __thiscall
punky::obj::type_to_string_abi_cxx11_(string *__return_storage_ptr__,obj *this,ObjectType *type)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "null";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "int";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "boolean";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "return";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "error";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "fn";
    pcVar2 = "";
    break;
  case 6:
    pcVar2 = "";
    pcVar3 = pcVar2;
    break;
  default:
    pcVar3 = "Default";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string type_to_string(const ObjectType& type)
{
    switch (type)
    {
        case ObjectType::Int:
            return "int";

        case ObjectType::Boolean:
            return "boolean";

        case ObjectType::Return:
            return "return";

        case ObjectType::Error:
            return "error";

        case ObjectType::Function:
            return "fn";

        case ObjectType::Null:
            return "null";

        case ObjectType::EmptyOut:
            return "";

        default:
            return "Default";
    }
}